

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int mg_get_server_ports(mg_context *ctx,int size,mg_server_port *ports)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  ulong uVar6;
  undefined1 auVar7 [13];
  usa *puVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  
  iVar10 = -1;
  if (0 < size) {
    memset(ports,0,(ulong)(uint)size << 5);
    if ((ctx != (mg_context *)0x0) && (ctx->listening_sockets != (socket *)0x0)) {
      puVar8 = &ctx->listening_sockets->lsa;
      iVar10 = 0;
      for (uVar9 = 0; ((uint)size != uVar9 && ((long)uVar9 < (long)(int)ctx->num_listening_sockets))
          ; uVar9 = uVar9 + 1) {
        ports[iVar10].port =
             (uint)(ushort)((puVar8->sin).sin_port << 8 | (puVar8->sin).sin_port >> 8);
        uVar1 = *(undefined4 *)(puVar8 + 2);
        uVar6 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
        auVar2._8_4_ = 0;
        auVar2._0_8_ = uVar6;
        auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
        auVar3[8] = (char)((uint)uVar1 >> 0x10);
        auVar3._0_8_ = uVar6;
        auVar3[9] = 0;
        auVar3._10_3_ = auVar2._10_3_;
        auVar7._5_8_ = 0;
        auVar7._0_5_ = auVar3._8_5_;
        auVar4[4] = (char)((uint)uVar1 >> 8);
        auVar4._0_4_ = (int)uVar6;
        auVar4[5] = 0;
        auVar4._6_7_ = SUB137(auVar7 << 0x40,6);
        auVar5._4_9_ = auVar4._4_9_;
        auVar5._0_4_ = (int)uVar6;
        ports[iVar10].is_ssl = (int)auVar5._0_8_;
        ports[iVar10].is_redirect = (int)((ulong)auVar5._0_8_ >> 0x20);
        iVar11 = 1;
        if ((puVar8->sa).sa_family == 2) {
LAB_0010b903:
          ports[iVar10].protocol = iVar11;
          iVar10 = iVar10 + 1;
        }
        else if ((puVar8->sa).sa_family == 10) {
          iVar11 = 3;
          goto LAB_0010b903;
        }
        puVar8 = (usa *)((long)puVar8 + 0x40);
      }
    }
  }
  return iVar10;
}

Assistant:

CIVETWEB_API int
mg_get_server_ports(const struct mg_context *ctx,
                    int size,
                    struct mg_server_port *ports)
{
	int i, cnt = 0;

	if (size <= 0) {
		return -1;
	}
	memset(ports, 0, sizeof(*ports) * (size_t)size);
	if (!ctx) {
		return -1;
	}
	if (!ctx->listening_sockets) {
		return -1;
	}

	for (i = 0; (i < size) && (i < (int)ctx->num_listening_sockets); i++) {

		ports[cnt].port =
		    ntohs(USA_IN_PORT_UNSAFE(&(ctx->listening_sockets[i].lsa)));
		ports[cnt].is_ssl = ctx->listening_sockets[i].is_ssl;
		ports[cnt].is_redirect = ctx->listening_sockets[i].ssl_redir;

		if (ctx->listening_sockets[i].lsa.sa.sa_family == AF_INET) {
			/* IPv4 */
			ports[cnt].protocol = 1;
			cnt++;
		} else if (ctx->listening_sockets[i].lsa.sa.sa_family == AF_INET6) {
			/* IPv6 */
			ports[cnt].protocol = 3;
			cnt++;
		}
	}

	return cnt;
}